

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

IStreamingReporterPtr __thiscall
Catch::ReporterFactory<Catch::CompactReporter>::create
          (ReporterFactory<Catch::CompactReporter> *this,ReporterConfig *config)

{
  undefined1 auVar1 [16];
  _func_int **pp_Var2;
  undefined1 (*in_RDX) [16];
  undefined1 auVar3 [16];
  
  pp_Var2 = (_func_int **)operator_new(0xb0);
  *(undefined2 *)(pp_Var2 + 1) = 0;
  auVar1 = *in_RDX;
  auVar3._0_8_ = auVar1._8_8_;
  auVar3._8_4_ = auVar1._0_4_;
  auVar3._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])(pp_Var2 + 2) = auVar3;
  pp_Var2[4] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 9) = 0;
  pp_Var2[10] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 0x11) = 0;
  *(undefined1 (*) [16])(pp_Var2 + 0x14) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pp_Var2 + 0x12) = (undefined1  [16])0x0;
  *pp_Var2 = (_func_int *)&PTR__CompactReporter_001bb108;
  (this->super_IReporterFactory)._vptr_IReporterFactory = pp_Var2;
  return (IStreamingReporterPtr)(IStreamingReporter *)this;
}

Assistant:

IStreamingReporterPtr create( ReporterConfig const& config ) const override {
            return Detail::make_unique<T>( config );
        }